

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O3

void do_pop_up_choice_proc(Am_Object param_1)

{
  undefined8 uVar1;
  Am_Value_List *pAVar2;
  ostream *poVar3;
  Am_Value v;
  Am_Value_List aAStack_38 [16];
  Am_Value local_28;
  Am_Value_List local_18 [16];
  
  Am_Value_List::Am_Value_List(local_18);
  uVar1 = Am_Value_List::Add(local_18,"First line of choice",1,1);
  pAVar2 = (Am_Value_List *)Am_Value_List::Add(uVar1,"Second Line of Choice",1,1);
  Am_Value_List::Am_Value_List(aAStack_38,pAVar2);
  Am_Get_Choice_From_Dialog(&local_28,aAStack_38,0xffffd8f0,0xffffd8f0,1);
  Am_Value_List::~Am_Value_List(aAStack_38);
  Am_Value_List::~Am_Value_List(local_18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Value returned is `",0x13);
  poVar3 = (ostream *)operator<<((ostream *)&std::cout,&local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
  std::ostream::flush();
  Am_Value::~Am_Value(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_pop_up_choice, (Am_Object /*cmd*/))
{
  Am_Value v = Am_Get_Choice_From_Dialog(
      Am_Value_List().Add("First line of choice").Add("Second Line of Choice"));
  std::cout << "Value returned is `" << v << "'\n" << std::flush;
}